

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O3

void __thiscall
duckdb::ExtensionOption::ExtensionOption
          (ExtensionOption *this,string *description_p,LogicalType *type_p,
          set_option_callback_t set_function_p,Value *default_value_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->description).field_2;
  (this->description)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (description_p->_M_dataplus)._M_p;
  paVar2 = &description_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&description_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->description).field_2 + 8) = uVar4;
  }
  else {
    (this->description)._M_dataplus._M_p = pcVar3;
    (this->description).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->description)._M_string_length = description_p->_M_string_length;
  (description_p->_M_dataplus)._M_p = (pointer)paVar2;
  description_p->_M_string_length = 0;
  (description_p->field_2)._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&this->type,type_p);
  this->set_function = set_function_p;
  Value::Value(&this->default_value,default_value_p);
  return;
}

Assistant:

ExtensionOption(string description_p, LogicalType type_p, set_option_callback_t set_function_p,
	                Value default_value_p)
	    : description(std::move(description_p)), type(std::move(type_p)), set_function(set_function_p),
	      default_value(std::move(default_value_p)) {
	}